

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cc
# Opt level: O1

bool __thiscall raptor::Server::Start(Server *this)

{
  raptor_error e;
  undefined1 local_30 [24];
  _func_int *local_18 [2];
  
  TcpServer::Start((TcpServer *)local_30);
  if ((Status *)local_30._0_8_ != (Status *)0x0) {
    Status::ToString_abi_cxx11_((string *)(local_30 + 8),(Status *)local_30._0_8_);
    LogFormatPrint("/workspace/llm4binary/github/license_all_cmakelists_1510/shadow-yuan[P]raptor/surface/server.cc"
                   ,0x47,kLogLevelError,"server: start (%s)",local_30._8_8_);
    if ((_func_int **)local_30._8_8_ != local_18) {
      operator_delete((void *)local_30._8_8_);
    }
  }
  RefCountedPtr<raptor::Status>::~RefCountedPtr((RefCountedPtr<raptor::Status> *)local_30);
  return (Status *)local_30._0_8_ == (Status *)0x0;
}

Assistant:

bool Server::Start() {
    raptor_error e = _impl->Start();
    if (e != RAPTOR_ERROR_NONE) {
        log_error("server: start (%s)", e->ToString().c_str());
        return false;
    }

    return true;
}